

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall Heap<int>::HeapifyUp(Heap<int> *this,int index)

{
  pointer piVar1;
  int temp;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  
  piVar1 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar1[index];
  iVar3 = (index - (index + -1 >> 0x1f)) + -1 >> 1;
  iVar5 = piVar1[iVar3];
  if (iVar5 < iVar2) {
    piVar4 = piVar1 + index;
    piVar6 = piVar1 + iVar3;
    do {
      *piVar4 = iVar5;
      *piVar6 = iVar2;
      piVar4 = piVar1 + iVar3;
      iVar2 = *piVar4;
      iVar3 = (iVar3 - (iVar3 + -1 >> 0x1f)) + -1 >> 1;
      piVar6 = piVar1 + iVar3;
      iVar5 = *piVar6;
    } while (iVar5 < iVar2);
  }
  return;
}

Assistant:

void Heap<T>::HeapifyUp(int index) {
    while (_data[index] > _data[(index - 1) / 2]) {
        Swap(index, (index - 1) / 2);
        index = (index - 1) / 2;
    }

}